

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QRect>::copyAppend(QGenericArrayOps<QRect> *this,QRect *b,QRect *e)

{
  qsizetype *pqVar1;
  QRect *pQVar2;
  QRect *pQVar3;
  Representation RVar4;
  Representation RVar5;
  Representation RVar6;
  
  if (b != e) {
    pQVar3 = (this->super_QArrayDataPointer<QRect>).ptr;
    for (; b < e; b = b + 1) {
      RVar4.m_i = (b->y1).m_i;
      RVar5.m_i = (b->x2).m_i;
      RVar6.m_i = (b->y2).m_i;
      pQVar2 = pQVar3 + (this->super_QArrayDataPointer<QRect>).size;
      pQVar2->x1 = (Representation)(b->x1).m_i;
      pQVar2->y1 = (Representation)RVar4.m_i;
      pQVar2->x2 = (Representation)RVar5.m_i;
      pQVar2->y2 = (Representation)RVar6.m_i;
      pqVar1 = &(this->super_QArrayDataPointer<QRect>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }